

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

void __thiscall icu_63::VTimeZone::load(VTimeZone *this,VTZReader *reader,UErrorCode *status)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  int8_t iVar5;
  short sVar6;
  uint uVar7;
  int32_t iVar8;
  undefined4 uVar9;
  UVector *pUVar10;
  ssize_t sVar11;
  UnicodeString *__nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar12;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  code *this_00;
  bool bVar13;
  UnicodeString line;
  undefined1 local_d2 [26];
  UnicodeString local_b8;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_38;
  
  this_00 = (code *)reader;
  local_d2._2_8_ = this;
  pUVar10 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)reader);
  if (pUVar10 == (UVector *)0x0) {
    pUVar10 = (UVector *)0x0;
    pvVar12 = extraout_RDX;
  }
  else {
    this_00 = uprv_deleteUObject_63;
    UVector::UVector(pUVar10,uprv_deleteUObject_63,uhash_compareUnicodeString_63,100,status);
    pvVar12 = extraout_RDX_00;
  }
  *(UVector **)(local_d2._2_8_ + 0x50) = pUVar10;
  if (U_ZERO_ERROR < *status) {
    return;
  }
  __nbytes = &local_b8;
  local_b8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
  local_b8.fUnion.fStackFields.fLengthAndFlags = 2;
  local_d2._10_8_ = 0;
  bVar2 = false;
  bVar3 = false;
  local_d2._18_8_ = status;
switchD_00209c80_caseD_0:
  sVar11 = VTZReader::read(reader,(int)this_00,pvVar12,(size_t)__nbytes);
  sVar6 = (short)sVar11;
  pvVar12 = extraout_RDX_01;
  if (sVar6 == 0xd) {
    __nbytes = (UnicodeString *)0x2;
  }
  else {
    uVar7 = (uint)sVar11 & 0xffff;
    if (uVar7 == 0xffff) {
      if (bVar2) {
        local_38 = ICAL_END_VTIMEZONE;
        iVar8 = u_strlen_63((UChar *)ICAL_END_VTIMEZONE);
        this_00 = (code *)0x0;
        iVar5 = UnicodeString::doCompare(&local_b8,0,iVar8,(UChar *)ICAL_END_VTIMEZONE,0,iVar8);
        bVar13 = iVar5 == '\0';
        local_48 = ICAL_END_VTIMEZONE;
        pvVar12 = extraout_RDX_02;
      }
      else {
        bVar13 = false;
      }
      __nbytes = (UnicodeString *)0x3;
      if (bVar13) {
        pUVar10 = *(UVector **)(local_d2._2_8_ + 0x50);
        this_00 = (code *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
        if ((UnicodeString *)this_00 == (UnicodeString *)0x0) {
          this_00 = (code *)0x0;
        }
        else {
          UnicodeString::UnicodeString((UnicodeString *)this_00,&local_b8);
        }
        status = (UErrorCode *)local_d2._18_8_;
        UVector::addElement(pUVar10,this_00,(UErrorCode *)local_d2._18_8_);
        local_d2._10_8_ = local_d2._10_8_ & 0xff;
        pvVar12 = (void *)0x1;
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          local_d2._10_8_ = 1;
        }
        __nbytes = (UnicodeString *)(ulong)((U_ZERO_ERROR < *status) + 3);
      }
    }
    else {
      if (bVar3) {
        bVar3 = false;
        if ((sVar6 != 9) && (bVar3 = false, uVar7 != 0x20)) {
          if (bVar2) {
            uVar9 = local_b8.fUnion.fFields.fLength;
            if (-1 < local_b8.fUnion.fStackFields.fLengthAndFlags) {
              uVar9 = (int)local_b8.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            if (0 < (int)uVar9) {
              pUVar10 = *(UVector **)(local_d2._2_8_ + 0x50);
              this_00 = (code *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
              if ((UnicodeString *)this_00 == (UnicodeString *)0x0) {
                this_00 = (code *)0x0;
              }
              else {
                UnicodeString::UnicodeString((UnicodeString *)this_00,&local_b8);
              }
              status = (UErrorCode *)local_d2._18_8_;
              UVector::addElement(pUVar10,this_00,(UErrorCode *)local_d2._18_8_);
              pvVar12 = extraout_RDX_07;
              if (U_ZERO_ERROR < *status) {
                __nbytes = (UnicodeString *)0x4;
                goto LAB_00209c4b;
              }
            }
          }
          uVar1 = local_b8.fUnion.fStackFields.fLengthAndFlags & 1;
          local_b8.fUnion.fStackFields.fLengthAndFlags =
               local_b8.fUnion.fStackFields.fLengthAndFlags & 0x1e;
          if (uVar1 != 0) {
            local_b8.fUnion.fStackFields.fLengthAndFlags = 2;
          }
          bVar3 = false;
          if (sVar6 != 10) {
            this_00 = (code *)local_d2;
            local_d2._0_2_ = sVar6;
            UnicodeString::doAppend(&local_b8,(UChar *)this_00,0,1);
            pvVar12 = extraout_RDX_08;
            goto LAB_00209a83;
          }
        }
      }
      else {
        if (sVar6 == 10) {
          if (bVar2) {
            local_50 = ICAL_END_VTIMEZONE;
            iVar8 = u_strlen_63((UChar *)ICAL_END_VTIMEZONE);
            this_00 = (code *)0x0;
            iVar5 = UnicodeString::doCompare(&local_b8,0,iVar8,(UChar *)ICAL_END_VTIMEZONE,0,iVar8);
            local_60 = ICAL_END_VTIMEZONE;
            __nbytes = (UnicodeString *)0x0;
            pvVar12 = extraout_RDX_03;
            if (iVar5 == '\0') {
              pUVar10 = *(UVector **)(local_d2._2_8_ + 0x50);
              this_00 = (code *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
              if ((UnicodeString *)this_00 == (UnicodeString *)0x0) {
                this_00 = (code *)0x0;
              }
              else {
                UnicodeString::UnicodeString((UnicodeString *)this_00,&local_b8);
              }
              status = (UErrorCode *)local_d2._18_8_;
              UVector::addElement(pUVar10,this_00,(UErrorCode *)local_d2._18_8_);
              local_d2._10_8_ = local_d2._10_8_ & 0xff;
              pvVar12 = (void *)0x1;
              if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                local_d2._10_8_ = 1;
              }
              __nbytes = (UnicodeString *)(ulong)((U_ZERO_ERROR < *status) + 3);
            }
LAB_00209c4b:
            bVar2 = true;
            bVar3 = true;
          }
          else {
            local_68 = ICAL_BEGIN_VTIMEZONE;
            iVar8 = u_strlen_63((UChar *)ICAL_BEGIN_VTIMEZONE);
            this_00 = (code *)0x0;
            iVar5 = UnicodeString::doCompare
                              (&local_b8,0,iVar8,(UChar *)ICAL_BEGIN_VTIMEZONE,0,iVar8);
            local_78 = ICAL_BEGIN_VTIMEZONE;
            bVar2 = false;
            bVar3 = true;
            pvVar12 = extraout_RDX_05;
            if (iVar5 != '\0') goto LAB_00209c70;
            pUVar10 = *(UVector **)(local_d2._2_8_ + 0x50);
            this_00 = (code *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
            if ((UnicodeString *)this_00 == (UnicodeString *)0x0) {
              this_00 = (code *)0x0;
            }
            else {
              UnicodeString::UnicodeString((UnicodeString *)this_00,&local_b8);
            }
            status = (UErrorCode *)local_d2._18_8_;
            UVector::addElement(pUVar10,this_00,(UErrorCode *)local_d2._18_8_);
            __nbytes = (UnicodeString *)0x0;
            if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
              uVar7 = (ushort)local_b8.fUnion.fStackFields.fLengthAndFlags & 0x1e;
              if ((local_b8.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
                uVar7 = 2;
              }
              pvVar12 = (void *)(ulong)uVar7;
              local_b8.fUnion.fStackFields.fLengthAndFlags = (int16_t)uVar7;
              bVar2 = true;
              bVar3 = false;
            }
            else {
              __nbytes = (UnicodeString *)0x4;
              bVar2 = false;
              pvVar12 = extraout_RDX_06;
            }
          }
          goto LAB_00209c72;
        }
        this_00 = (code *)local_d2;
        local_d2._0_2_ = sVar6;
        UnicodeString::doAppend(&local_b8,(UChar *)this_00,0,1);
        pvVar12 = extraout_RDX_04;
LAB_00209a83:
        bVar3 = false;
      }
LAB_00209c70:
      __nbytes = (UnicodeString *)0x0;
    }
  }
LAB_00209c72:
  uVar4 = local_d2._2_8_;
  switch(__nbytes) {
  case (UnicodeString *)0x0:
  case (UnicodeString *)0x2:
    goto switchD_00209c80_caseD_0;
  case (UnicodeString *)0x3:
    if (local_d2[10] != '\0') {
      parse((VTimeZone *)local_d2._2_8_,status);
      goto switchD_00209c80_caseD_1;
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_INVALID_STATE_ERROR;
    }
  case (UnicodeString *)0x4:
    if (*(UVector **)(local_d2._2_8_ + 0x50) != (UVector *)0x0) {
      (*((*(UVector **)(local_d2._2_8_ + 0x50))->super_UObject)._vptr_UObject[1])();
    }
    *(UVector **)(uVar4 + 0x50) = (UVector *)0x0;
  default:
switchD_00209c80_caseD_1:
    UnicodeString::~UnicodeString(&local_b8);
    return;
  }
}

Assistant:

void
VTimeZone::load(VTZReader& reader, UErrorCode& status) {
    vtzlines = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, DEFAULT_VTIMEZONE_LINES, status);
    if (U_FAILURE(status)) {
        return;
    }
    UBool eol = FALSE;
    UBool start = FALSE;
    UBool success = FALSE;
    UnicodeString line;

    while (TRUE) {
        UChar ch = reader.read();
        if (ch == 0xFFFF) {
            // end of file
            if (start && line.startsWith(ICAL_END_VTIMEZONE, -1)) {
                vtzlines->addElement(new UnicodeString(line), status);
                if (U_FAILURE(status)) {
                    goto cleanupVtzlines;
                }
                success = TRUE;
            }
            break;
        }
        if (ch == 0x000D) {
            // CR, must be followed by LF according to the definition in RFC2445
            continue;
        }
        if (eol) {
            if (ch != 0x0009 && ch != 0x0020) {
                // NOT followed by TAB/SP -> new line
                if (start) {
                    if (line.length() > 0) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                    }
                }
                line.remove();
                if (ch != 0x000A) {
                    line.append(ch);
                }
            }
            eol = FALSE;
        } else {
            if (ch == 0x000A) {
                // LF
                eol = TRUE;
                if (start) {
                    if (line.startsWith(ICAL_END_VTIMEZONE, -1)) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                        success = TRUE;
                        break;
                    }
                } else {
                    if (line.startsWith(ICAL_BEGIN_VTIMEZONE, -1)) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                        line.remove();
                        start = TRUE;
                        eol = FALSE;
                    }
                }
            } else {
                line.append(ch);
            }
        }
    }
    if (!success) {
        if (U_SUCCESS(status)) {
            status = U_INVALID_STATE_ERROR;
        }
        goto cleanupVtzlines;
    }
    parse(status);
    return;

cleanupVtzlines:
    delete vtzlines;
    vtzlines = NULL;
}